

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  GLFWglproc proc;
  _GLFWwindow *window;
  char *procname_local;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if ((*(long *)((long)pvVar1 + 0x298) == 0) ||
     (procname_local = (char *)dlsym(*(undefined8 *)((long)pvVar1 + 0x298),procname),
     procname_local == (char *)0x0)) {
    procname_local = (char *)(*_glfw.egl.GetProcAddress)(procname);
  }
  return (GLFWglproc)procname_local;
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc) _glfw_dlsym(window->context.egl.client,
                                                   procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}